

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::Session::runInternal(Session *this)

{
  shared_ptr<Catch::Config> *__r;
  RunContext *this_00;
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pTVar3;
  undefined8 *puVar4;
  element_type *peVar5;
  long lVar6;
  size_t sVar7;
  pointer pFVar8;
  int iVar9;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *pvVar10;
  long lVar11;
  ulong uVar12;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar13;
  undefined4 extraout_var;
  long *plVar14;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> _Var15;
  undefined4 extraout_var_00;
  undefined8 *puVar16;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Base_ptr p_Var17;
  FilterMatch *match_1;
  pointer pFVar18;
  pointer pTVar19;
  TestCase *test;
  __uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  local_318;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_310;
  vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
  *local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  IConfigPtr local_290;
  _Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
  local_280;
  TestGroup tests;
  
  if (this->m_startupExceptions == false) {
    iVar9 = 0;
    if (((this->m_configData).showHelp == false) &&
       (iVar9 = 0, (this->m_configData).libIdentify == false)) {
      config(this);
      seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_IConfig);
      __r = &this->m_config;
      if ((this->m_configData).filenamesAsTags == true) {
        pvVar10 = getAllTestCasesSorted
                            (&((__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->super_IConfig);
        pTVar3 = (pvVar10->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pTVar19 = (pvVar10->
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                       _M_impl.super__Vector_impl_data._M_start; pTVar19 != pTVar3;
            pTVar19 = pTVar19 + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tags,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&(pTVar19->super_TestCaseInfo).tags);
          std::__cxx11::string::string
                    ((string *)&tests,(pTVar19->super_TestCaseInfo).lineInfo.file,
                     (allocator *)&local_290);
          lVar11 = std::__cxx11::string::find_last_of((char *)&tests,0x16789a);
          if (lVar11 == -1) {
            std::__cxx11::string::insert((ulong)&tests,(char *)0x0);
          }
          else {
            std::__cxx11::string::erase((ulong)&tests,0);
            *(undefined1 *)
             &((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_IConfig).super_NonCopyable._vptr_NonCopyable = 0x23;
          }
          uVar12 = std::__cxx11::string::rfind((char)&tests,0x2e);
          if (uVar12 != 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)&tests,uVar12);
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&tags,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tests);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&totals,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tags);
          setTags(&pTVar19->super_TestCaseInfo,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&totals);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&totals);
          std::__cxx11::string::~string((string *)&tests);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tags);
        }
      }
      list((Catch *)&tests,__r);
      if (tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        clara::std::__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)&tests,
                   &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Catch::Config,void>
                  ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&local_290,
                   &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
        pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar9 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar13);
        plVar14 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x20))
                                    ((long *)CONCAT44(extraout_var,iVar9));
        if (*plVar14 == plVar14[1]) {
          peVar5 = (__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Catch::Config,void>
                    ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&tags,
                     &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
          anon_unknown_1::createReporter
                    ((anon_unknown_1 *)&local_318,&(peVar5->m_data).reporterName,(IConfigPtr *)&tags
                    );
        }
        else {
          _Var15._M_head_impl = (IStreamingReporter *)operator_new(0x30);
          ((IStreamingReporter *)&(_Var15._M_head_impl)->_vptr_IStreamingReporter)->
          _vptr_IStreamingReporter = (_func_int **)&PTR__ListeningReporter_0019ea40;
          (((Reporters *)(_Var15._M_head_impl + 1))->
          super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          _Var15._M_head_impl[2] = (_func_int **)0x0;
          _Var15._M_head_impl[3] = (_func_int **)0x0;
          (((IStreamingReporterPtr *)(_Var15._M_head_impl + 4))->_M_t).
          super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (IStreamingReporter *)0x0;
          *(bool *)&_Var15._M_head_impl[5]._vptr_IStreamingReporter = false;
          *(bool *)((long)&_Var15._M_head_impl[5]._vptr_IStreamingReporter + 1) = true;
          local_318._M_t.
          super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
          .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               (tuple<Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>)
               _Var15._M_head_impl;
          pSVar13 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                    ::getInternal();
          iVar9 = (*(pSVar13->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar13);
          puVar16 = (undefined8 *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar9) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar9));
          local_308 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                       *)(_Var15._M_head_impl + 1);
          puVar4 = (undefined8 *)puVar16[1];
          local_280.super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
               (_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)
               (_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)_Var15._M_head_impl;
          for (puVar16 = (undefined8 *)*puVar16; puVar16 != puVar4; puVar16 = puVar16 + 2) {
            plVar14 = (long *)*puVar16;
            std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<Catch::Config,void>
                      ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&totals,
                       &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
            ReporterConfig::ReporterConfig((ReporterConfig *)&tags,(IConfigPtr *)&totals);
            (**(code **)(*plVar14 + 0x10))(&local_310,plVar14,(ReporterConfig *)&tags);
            std::
            vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
            ::
            emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                      (local_308,
                       (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)&local_310);
            if (local_310._M_head_impl != (IStreamingReporter *)0x0) {
              (*(local_310._M_head_impl)->_vptr_IStreamingReporter[1])();
            }
            local_310._M_head_impl = (IStreamingReporter *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &tags.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&totals.assertions);
          }
          peVar5 = (__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<Catch::Config,void>
                    ((__shared_ptr<Catch::IConfig_const,(__gnu_cxx::_Lock_policy)2> *)&tags,
                     &__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>);
          anon_unknown_1::createReporter
                    ((anon_unknown_1 *)&totals,&(peVar5->m_data).reporterName,(IConfigPtr *)&tags);
          ListeningReporter::addReporter
                    ((ListeningReporter *)
                     local_280.super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                     _M_head_impl,(IStreamingReporterPtr *)&totals);
          if (totals._0_8_ != 0) {
            (**(code **)(*(long *)totals._0_8_ + 8))();
          }
          totals.error = 0;
          totals._4_4_ = 0;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &tags.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        this_00 = &tests.m_context;
        RunContext::RunContext(this_00,&local_290,(IStreamingReporterPtr *)&local_318);
        if (local_318._M_t.
            super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
            .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             )0x0) {
          (**(code **)(*(long *)local_318._M_t.
                                super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                _M_head_impl + 8))();
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_290.super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var1 = &tests.m_tests._M_t._M_impl.super__Rb_tree_header;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        tests.m_matches.
        super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        pvVar10 = getAllTestCasesSorted
                            (&(tests.m_config.
                               super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              ->super_IConfig);
        iVar9 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        TestSpec::matchesByFilter
                  ((Matches *)&tags,(TestSpec *)CONCAT44(extraout_var_01,iVar9),pvVar10,
                   &(tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_IConfig);
        clara::std::
        vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
        _M_move_assign(&tests.m_matches,
                       (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                        *)&tags);
        clara::std::
        vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::~vector
                  ((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                    *)&tags);
        iVar9 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        pFVar8 = tests.m_matches.
                 super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pFVar18 = tests.m_matches.
                  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((tests.m_matches.
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             tests.m_matches.
             super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           (*(long *)(CONCAT44(extraout_var_02,iVar9) + 0x18) ==
            *(long *)(CONCAT44(extraout_var_02,iVar9) + 0x20))) {
          pTVar3 = (pvVar10->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pTVar19 = (pvVar10->
                         super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                         _M_impl.super__Vector_impl_data._M_start; pTVar19 != pTVar3;
              pTVar19 = pTVar19 + 1) {
            if (((pTVar19->super_TestCaseInfo).properties & IsHidden) == None) {
              tags.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar19;
              std::
              _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
              ::_M_emplace_unique<Catch::TestCase_const*>
                        ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                          *)&tests.m_tests,(TestCase **)&tags);
            }
          }
        }
        else {
          for (; pFVar18 != pFVar8; pFVar18 = pFVar18 + 1) {
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::
            _M_insert_range_unique<__gnu_cxx::__normal_iterator<Catch::TestCase_const*const*,std::vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>>>>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)&tests.m_tests,
                       (__normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
                        )(pFVar18->tests).
                         super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
                        )(pFVar18->tests).
                         super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        iVar9 = (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
        totals._0_8_ = totals._0_8_ & 0xffffffff00000000;
        totals.assertions.passed = 0;
        totals.assertions.failed = 0;
        totals.assertions.failedButOk = 0;
        totals.testCases.passed = 0;
        totals.testCases.failed = 0;
        totals.testCases.failedButOk = 0;
        (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(&tags);
        local_308 = (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                     *)CONCAT44(extraout_var_03,iVar9);
        RunContext::testGroupStarting(this_00,(string *)&tags,1,1);
        std::__cxx11::string::~string((string *)&tags);
        for (p_Var17 = tests.m_tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pFVar8 = tests.m_matches.
                     super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            sVar7 = tests.m_context.m_totals.assertions.failed,
            pFVar18 = tests.m_matches.
                      super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            (_Rb_tree_header *)p_Var17 != p_Var1;
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
          iVar9 = (*((tests.m_context.m_config.
                      super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_NonCopyable)._vptr_NonCopyable[9])();
          if (sVar7 < (ulong)(long)iVar9) {
            RunContext::runTest((Totals *)&tags,this_00,*(TestCase **)(p_Var17 + 1));
            Totals::operator+=(&totals,(Totals *)&tags);
          }
          else {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x78))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       *(undefined8 *)(p_Var17 + 1));
          }
        }
        for (; pFVar18 != pFVar8; pFVar18 = pFVar18 + 1) {
          if ((pFVar18->tests).
              super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              (pFVar18->tests).
              super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x18))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       pFVar18);
            totals.error = -1;
          }
        }
        lVar11 = *(long *)((long)local_308 + 0x18);
        lVar6 = *(long *)((long)local_308 + 0x20);
        if (lVar11 != lVar6) {
          for (; lVar11 != lVar6; lVar11 = lVar11 + 0x20) {
            (**(code **)(*(long *)tests.m_context.m_reporter._M_t.
                                  super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                                  .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>.
                                  _M_head_impl + 0x20))
                      (tests.m_context.m_reporter._M_t.
                       super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
                       .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl,
                       lVar11);
          }
        }
        (*((tests.m_config.super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(&tags);
        RunContext::testGroupEnded(this_00,(string *)&tags,&totals,1,1);
        std::__cxx11::string::~string((string *)&tags);
        iVar9 = (*(((__r->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
        if (((byte)iVar9 & totals.error == -1) == 0) {
          iVar9 = (int)totals.assertions.failed;
          if ((int)totals.assertions.failed < totals.error) {
            iVar9 = totals.error;
          }
          if (0xfe < iVar9) {
            iVar9 = 0xff;
          }
        }
        else {
          iVar9 = 2;
        }
        anon_unknown_1::TestGroup::~TestGroup(&tests);
      }
      else {
        iVar2 = *(int *)&((tests.m_config.
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         super_IConfig).super_NonCopyable._vptr_NonCopyable;
        iVar9 = 0xff;
        if (iVar2 < 0xff) {
          iVar9 = iVar2;
        }
      }
    }
  }
  else {
    iVar9 = 1;
  }
  return iVar9;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return (std::min) (MaxExitCode, static_cast<int>(*listed));

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }